

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ParseStringFlag<std::__cxx11::string>
               (char *str,char *flag,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  char *value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  char *flag_local;
  char *str_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar2 = ParseFlagValue(str,flag,false);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)value,pcVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

static bool ParseStringFlag(const char* str, const char* flag, String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}